

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.H
# Opt level: O3

void __thiscall Fl_Text_Display::previous_word(Fl_Text_Display *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (this->mCursorPos == 0) {
    return;
  }
  iVar1 = Fl_Text_Buffer::prev_char(this->mBuffer,this->mCursorPos);
  for (; iVar3 = 0, iVar1 != 0; iVar1 = Fl_Text_Buffer::prev_char(this->mBuffer,iVar1)) {
    uVar2 = Fl_Text_Buffer::char_at(this->mBuffer,iVar1);
    if (((uVar2 == 0x24) || (uVar2 == 0x5f)) ||
       ((iVar3 = isspace(uVar2), iVar3 == 0 && (iVar3 = ispunct(uVar2), iVar3 == 0))))
    goto LAB_001d3ba5;
  }
  goto LAB_001d3bf5;
  while (iVar1 = Fl_Text_Buffer::prev_char(this->mBuffer,iVar1), iVar3 = 0, iVar1 != 0) {
LAB_001d3ba5:
    uVar2 = Fl_Text_Buffer::char_at(this->mBuffer,iVar1);
    if (((uVar2 != 0x24) && (uVar2 != 0x5f)) &&
       ((iVar4 = isspace(uVar2), iVar3 = iVar1, iVar4 != 0 || (iVar4 = ispunct(uVar2), iVar4 != 0)))
       ) break;
  }
LAB_001d3bf5:
  uVar2 = Fl_Text_Buffer::char_at(this->mBuffer,iVar3);
  if (((uVar2 != 0x24) && (uVar2 != 0x5f)) &&
     ((iVar1 = isspace(uVar2), iVar1 != 0 || (iVar1 = ispunct(uVar2), iVar1 != 0)))) {
    iVar3 = Fl_Text_Buffer::next_char(this->mBuffer,iVar3);
  }
  insert_position(this,iVar3);
  return;
}

Assistant:

int insert_position() const { return mCursorPos; }